

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool ts_parser__better_version_exists
                (TSParser *self,StackVersion version,_Bool is_in_error,uint cost)

{
  ErrorStatus a;
  _Bool _Var1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  ErrorComparison EVar5;
  Length LVar6;
  Length LVar7;
  ErrorStatus b;
  ErrorStatus status_i;
  uint local_64;
  StackVersion local_54;
  StackVersion n;
  StackVersion i;
  ErrorStatus status;
  uint local_30;
  Length position;
  uint cost_local;
  _Bool is_in_error_local;
  StackVersion version_local;
  TSParser *self_local;
  
  if (((self->finished_tree).ptr == (SubtreeHeapData *)0x0) ||
     (uVar2 = ts_subtree_error_cost(self->finished_tree), cost < uVar2)) {
    LVar6 = ts_stack_position(self->stack,version);
    uVar3 = ts_stack_node_count_since_error(self->stack,version);
    iVar4 = ts_stack_dynamic_precedence(self->stack,version);
    status.node_count = CONCAT31(status.node_count._1_3_,is_in_error);
    local_54 = 0;
    uVar2 = ts_stack_version_count(self->stack);
    for (; local_54 < uVar2; local_54 = local_54 + 1) {
      if ((local_54 != version) && (_Var1 = ts_stack_is_active(self->stack,local_54), _Var1)) {
        LVar7 = ts_stack_position(self->stack,local_54);
        local_64 = LVar7.bytes;
        local_30 = LVar6.bytes;
        if (local_30 <= local_64) {
          b = ts_parser__version_status(self,local_54);
          a.node_count = uVar3;
          a.cost = cost;
          a.dynamic_precedence = iVar4;
          a._12_4_ = status.node_count;
          EVar5 = ts_parser__compare_versions(self,a,b);
          if (EVar5 == ErrorComparisonPreferRight) {
            _Var1 = ts_stack_can_merge(self->stack,local_54,version);
            if (_Var1) {
              return true;
            }
          }
          else if (EVar5 == ErrorComparisonTakeRight) {
            return true;
          }
        }
      }
    }
    self_local._7_1_ = false;
  }
  else {
    self_local._7_1_ = true;
  }
  return self_local._7_1_;
}

Assistant:

static bool ts_parser__better_version_exists(TSParser *self, StackVersion version,
                                             bool is_in_error, unsigned cost) {
  if (self->finished_tree.ptr && ts_subtree_error_cost(self->finished_tree) <= cost) {
    return true;
  }

  Length position = ts_stack_position(self->stack, version);
  ErrorStatus status = {
    .cost = cost,
    .is_in_error = is_in_error,
    .dynamic_precedence = ts_stack_dynamic_precedence(self->stack, version),
    .node_count = ts_stack_node_count_since_error(self->stack, version),
  };

  for (StackVersion i = 0, n = ts_stack_version_count(self->stack); i < n; i++) {
    if (i == version ||
        !ts_stack_is_active(self->stack, i) ||
        ts_stack_position(self->stack, i).bytes < position.bytes) continue;
    ErrorStatus status_i = ts_parser__version_status(self, i);
    switch (ts_parser__compare_versions(self, status, status_i)) {
      case ErrorComparisonTakeRight:
        return true;
      case ErrorComparisonPreferRight:
        if (ts_stack_can_merge(self->stack, i, version)) return true;
      default:
        break;
    }
  }

  return false;
}